

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzz_issue_tests.cpp
# Opt level: O2

void __thiscall
roundTripString_rtripconversions_Test::roundTripString_rtripconversions_Test
          (roundTripString_rtripconversions_Test *this)

{
  roundTripString::roundTripString(&this->super_roundTripString);
  (this->super_roundTripString).
  super_TestWithParam<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .super_Test._vptr_Test = (_func_int **)&PTR__TestWithParam_001b2ef8;
  (this->super_roundTripString).
  super_TestWithParam<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .
  super_WithParamInterface<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._vptr_WithParamInterface = (_func_int **)&PTR__roundTripString_rtripconversions_Test_001b2f38;
  return;
}

Assistant:

TEST_P(roundTripString, rtripconversions)
{
    auto u1 = unit_from_string(GetParam());
    EXPECT_FALSE(is_error(u1));
    auto str = to_string(u1);
    auto u2 = unit_from_string(str);
    EXPECT_FALSE(is_error(u2));
    EXPECT_EQ(unit_cast(u2), unit_cast(u1));
}